

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O2

void duckdb::FlattenRunEndsSwitch<int>
               (Vector *result,ArrowRunEndEncodingState *run_end_encoding,idx_t compressed_size,
               idx_t scan_offset,idx_t size)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this;
  PhysicalType PVar1;
  data_ptr_t pdVar2;
  undefined8 uVar3;
  type pVVar4;
  type pVVar5;
  ulong uVar6;
  ulong uVar7;
  NotImplementedException *this_00;
  PhysicalType type;
  ulong uVar8;
  ulong uVar9;
  idx_t i;
  ulong uVar10;
  idx_t iVar11;
  data_ptr_t pdVar12;
  bool bVar13;
  ulong local_130;
  ulong local_128;
  UnifiedVectorFormat local_f8;
  UnifiedVectorFormat run_end_format;
  __shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  this = &run_end_encoding->values;
  pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
  PVar1 = (pVVar4->type).physical_type_;
  switch(PVar1) {
  case BOOL:
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
    Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      uVar9 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar8 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar7 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
        uVar8 = size - uVar9;
        if (uVar10 < size - uVar9) {
          uVar8 = uVar10;
        }
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          pdVar2[uVar10 + uVar9] = local_f8.data[uVar7];
        }
        uVar9 = uVar9 + uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar9 < size);
    }
    else {
      local_130 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar9 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_130);
        uVar9 = size - local_130;
        if (uVar7 < size - local_130) {
          uVar9 = uVar7;
        }
        uVar7 = uVar9;
        iVar11 = local_130;
        uVar10 = local_130;
        if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
             >> (uVar8 & 0x3f) & 1) == 0) {
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          while (uVar7 != 0) {
            pdVar2[iVar11] = local_f8.data[uVar8];
            TemplatedValidityMask<unsigned_long>::SetValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
            uVar7 = uVar7 - 1;
            iVar11 = iVar11 + 1;
          }
        }
        local_130 = local_130 + uVar9;
        uVar6 = uVar6 + 1;
      } while (local_130 < size);
    }
    break;
  case UINT8:
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
    Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      uVar9 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar8 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar7 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
        uVar8 = size - uVar9;
        if (uVar10 < size - uVar9) {
          uVar8 = uVar10;
        }
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          pdVar2[uVar10 + uVar9] = local_f8.data[uVar7];
        }
        uVar9 = uVar9 + uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar9 < size);
    }
    else {
      local_130 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar9 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_130);
        uVar9 = size - local_130;
        if (uVar7 < size - local_130) {
          uVar9 = uVar7;
        }
        uVar7 = uVar9;
        iVar11 = local_130;
        uVar10 = local_130;
        if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
             >> (uVar8 & 0x3f) & 1) == 0) {
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          while (uVar7 != 0) {
            pdVar2[iVar11] = local_f8.data[uVar8];
            TemplatedValidityMask<unsigned_long>::SetValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
            uVar7 = uVar7 - 1;
            iVar11 = iVar11 + 1;
          }
        }
        local_130 = local_130 + uVar9;
        uVar6 = uVar6 + 1;
      } while (local_130 < size);
    }
    break;
  case INT8:
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
    Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      uVar9 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar8 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar7 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
        uVar8 = size - uVar9;
        if (uVar10 < size - uVar9) {
          uVar8 = uVar10;
        }
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          pdVar2[uVar10 + uVar9] = local_f8.data[uVar7];
        }
        uVar9 = uVar9 + uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar9 < size);
    }
    else {
      local_130 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar9 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_130);
        uVar9 = size - local_130;
        if (uVar7 < size - local_130) {
          uVar9 = uVar7;
        }
        uVar7 = uVar9;
        iVar11 = local_130;
        uVar10 = local_130;
        if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
             >> (uVar8 & 0x3f) & 1) == 0) {
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          while (uVar7 != 0) {
            pdVar2[iVar11] = local_f8.data[uVar8];
            TemplatedValidityMask<unsigned_long>::SetValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
            uVar7 = uVar7 - 1;
            iVar11 = iVar11 + 1;
          }
        }
        local_130 = local_130 + uVar9;
        uVar6 = uVar6 + 1;
      } while (local_130 < size);
    }
    break;
  case UINT16:
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
    Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      uVar9 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar8 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar7 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
        uVar8 = size - uVar9;
        if (uVar10 < size - uVar9) {
          uVar8 = uVar10;
        }
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          *(undefined2 *)(pdVar2 + uVar10 * 2 + uVar9 * 2) =
               *(undefined2 *)(local_f8.data + uVar7 * 2);
        }
        uVar9 = uVar9 + uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar9 < size);
    }
    else {
      local_130 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar9 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_130);
        uVar9 = size - local_130;
        if (uVar7 < size - local_130) {
          uVar9 = uVar7;
        }
        uVar7 = uVar9;
        iVar11 = local_130;
        uVar10 = local_130;
        if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
             >> (uVar8 & 0x3f) & 1) == 0) {
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          while (uVar7 != 0) {
            *(undefined2 *)(pdVar2 + iVar11 * 2) = *(undefined2 *)(local_f8.data + uVar8 * 2);
            TemplatedValidityMask<unsigned_long>::SetValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
            uVar7 = uVar7 - 1;
            iVar11 = iVar11 + 1;
          }
        }
        local_130 = local_130 + uVar9;
        uVar6 = uVar6 + 1;
      } while (local_130 < size);
    }
    break;
  case INT16:
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
    Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      uVar9 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar8 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar7 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
        uVar8 = size - uVar9;
        if (uVar10 < size - uVar9) {
          uVar8 = uVar10;
        }
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          *(undefined2 *)(pdVar2 + uVar10 * 2 + uVar9 * 2) =
               *(undefined2 *)(local_f8.data + uVar7 * 2);
        }
        uVar9 = uVar9 + uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar9 < size);
    }
    else {
      local_130 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar9 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_130);
        uVar9 = size - local_130;
        if (uVar7 < size - local_130) {
          uVar9 = uVar7;
        }
        uVar7 = uVar9;
        iVar11 = local_130;
        uVar10 = local_130;
        if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
             >> (uVar8 & 0x3f) & 1) == 0) {
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          while (uVar7 != 0) {
            *(undefined2 *)(pdVar2 + iVar11 * 2) = *(undefined2 *)(local_f8.data + uVar8 * 2);
            TemplatedValidityMask<unsigned_long>::SetValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
            uVar7 = uVar7 - 1;
            iVar11 = iVar11 + 1;
          }
        }
        local_130 = local_130 + uVar9;
        uVar6 = uVar6 + 1;
      } while (local_130 < size);
    }
    break;
  case UINT32:
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
    Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      uVar9 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar8 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar7 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
        uVar8 = size - uVar9;
        if (uVar10 < size - uVar9) {
          uVar8 = uVar10;
        }
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          *(undefined4 *)(pdVar2 + uVar10 * 4 + uVar9 * 4) =
               *(undefined4 *)(local_f8.data + uVar7 * 4);
        }
        uVar9 = uVar9 + uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar9 < size);
    }
    else {
      local_130 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar9 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_130);
        uVar9 = size - local_130;
        if (uVar7 < size - local_130) {
          uVar9 = uVar7;
        }
        uVar7 = uVar9;
        iVar11 = local_130;
        uVar10 = local_130;
        if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
             >> (uVar8 & 0x3f) & 1) == 0) {
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          while (uVar7 != 0) {
            *(undefined4 *)(pdVar2 + iVar11 * 4) = *(undefined4 *)(local_f8.data + uVar8 * 4);
            TemplatedValidityMask<unsigned_long>::SetValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
            uVar7 = uVar7 - 1;
            iVar11 = iVar11 + 1;
          }
        }
        local_130 = local_130 + uVar9;
        uVar6 = uVar6 + 1;
      } while (local_130 < size);
    }
    break;
  case INT32:
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
    Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      uVar9 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar8 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar7 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
        uVar8 = size - uVar9;
        if (uVar10 < size - uVar9) {
          uVar8 = uVar10;
        }
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          *(undefined4 *)(pdVar2 + uVar10 * 4 + uVar9 * 4) =
               *(undefined4 *)(local_f8.data + uVar7 * 4);
        }
        uVar9 = uVar9 + uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar9 < size);
    }
    else {
      local_130 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar9 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_130);
        uVar9 = size - local_130;
        if (uVar7 < size - local_130) {
          uVar9 = uVar7;
        }
        uVar7 = uVar9;
        iVar11 = local_130;
        uVar10 = local_130;
        if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
             >> (uVar8 & 0x3f) & 1) == 0) {
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          while (uVar7 != 0) {
            *(undefined4 *)(pdVar2 + iVar11 * 4) = *(undefined4 *)(local_f8.data + uVar8 * 4);
            TemplatedValidityMask<unsigned_long>::SetValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
            uVar7 = uVar7 - 1;
            iVar11 = iVar11 + 1;
          }
        }
        local_130 = local_130 + uVar9;
        uVar6 = uVar6 + 1;
      } while (local_130 < size);
    }
    break;
  case UINT64:
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
    Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      uVar9 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar8 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar7 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
        uVar8 = size - uVar9;
        if (uVar10 < size - uVar9) {
          uVar8 = uVar10;
        }
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          *(undefined8 *)(pdVar2 + uVar10 * 8 + uVar9 * 8) =
               *(undefined8 *)(local_f8.data + uVar7 * 8);
        }
        uVar9 = uVar9 + uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar9 < size);
    }
    else {
      local_130 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar9 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_130);
        uVar9 = size - local_130;
        if (uVar7 < size - local_130) {
          uVar9 = uVar7;
        }
        uVar7 = uVar9;
        iVar11 = local_130;
        uVar10 = local_130;
        if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
             >> (uVar8 & 0x3f) & 1) == 0) {
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          while (uVar7 != 0) {
            *(undefined8 *)(pdVar2 + iVar11 * 8) = *(undefined8 *)(local_f8.data + uVar8 * 8);
            TemplatedValidityMask<unsigned_long>::SetValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
            uVar7 = uVar7 - 1;
            iVar11 = iVar11 + 1;
          }
        }
        local_130 = local_130 + uVar9;
        uVar6 = uVar6 + 1;
      } while (local_130 < size);
    }
    break;
  case INT64:
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
    Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      uVar9 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar8 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar7 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
        uVar8 = size - uVar9;
        if (uVar10 < size - uVar9) {
          uVar8 = uVar10;
        }
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          *(undefined8 *)(pdVar2 + uVar10 * 8 + uVar9 * 8) =
               *(undefined8 *)(local_f8.data + uVar7 * 8);
        }
        uVar9 = uVar9 + uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar9 < size);
    }
    else {
      local_130 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar9 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_130);
        uVar9 = size - local_130;
        if (uVar7 < size - local_130) {
          uVar9 = uVar7;
        }
        uVar7 = uVar9;
        iVar11 = local_130;
        uVar10 = local_130;
        if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
             >> (uVar8 & 0x3f) & 1) == 0) {
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          while (uVar7 != 0) {
            *(undefined8 *)(pdVar2 + iVar11 * 8) = *(undefined8 *)(local_f8.data + uVar8 * 8);
            TemplatedValidityMask<unsigned_long>::SetValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
            uVar7 = uVar7 - 1;
            iVar11 = iVar11 + 1;
          }
        }
        local_130 = local_130 + uVar9;
        uVar6 = uVar6 + 1;
      } while (local_130 < size);
    }
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_018b57cd_caseD_a:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&run_end_format,"RunEndEncoded value type \'%s\' not supported yet",
               (allocator *)&local_f8);
    TypeIdToString_abi_cxx11_(&local_50,(duckdb *)(ulong)PVar1,type);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_00,(string *)&run_end_format,&local_50);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
    Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      uVar9 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar8 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar7 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
        uVar8 = size - uVar9;
        if (uVar10 < size - uVar9) {
          uVar8 = uVar10;
        }
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          *(undefined4 *)(pdVar2 + uVar10 * 4 + uVar9 * 4) =
               *(undefined4 *)(local_f8.data + uVar7 * 4);
        }
        uVar9 = uVar9 + uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar9 < size);
    }
    else {
      local_130 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar9 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_130);
        uVar9 = size - local_130;
        if (uVar7 < size - local_130) {
          uVar9 = uVar7;
        }
        uVar7 = uVar9;
        iVar11 = local_130;
        uVar10 = local_130;
        if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
             >> (uVar8 & 0x3f) & 1) == 0) {
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          while (uVar7 != 0) {
            *(undefined4 *)(pdVar2 + iVar11 * 4) = *(undefined4 *)(local_f8.data + uVar8 * 4);
            TemplatedValidityMask<unsigned_long>::SetValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
            uVar7 = uVar7 - 1;
            iVar11 = iVar11 + 1;
          }
        }
        local_130 = local_130 + uVar9;
        uVar6 = uVar6 + 1;
      } while (local_130 < size);
    }
    break;
  case DOUBLE:
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
    Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      uVar9 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar8 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar7 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
        uVar8 = size - uVar9;
        if (uVar10 < size - uVar9) {
          uVar8 = uVar10;
        }
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          *(undefined8 *)(pdVar2 + uVar10 * 8 + uVar9 * 8) =
               *(undefined8 *)(local_f8.data + uVar7 * 8);
        }
        uVar9 = uVar9 + uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar9 < size);
    }
    else {
      local_130 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar9 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_130);
        uVar9 = size - local_130;
        if (uVar7 < size - local_130) {
          uVar9 = uVar7;
        }
        uVar7 = uVar9;
        iVar11 = local_130;
        uVar10 = local_130;
        if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
             >> (uVar8 & 0x3f) & 1) == 0) {
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          while (uVar7 != 0) {
            *(undefined8 *)(pdVar2 + iVar11 * 8) = *(undefined8 *)(local_f8.data + uVar8 * 8);
            TemplatedValidityMask<unsigned_long>::SetValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
            uVar7 = uVar7 - 1;
            iVar11 = iVar11 + 1;
          }
        }
        local_130 = local_130 + uVar9;
        uVar6 = uVar6 + 1;
      } while (local_130 < size);
    }
    break;
  case INTERVAL:
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (&run_end_encoding->run_ends);
    pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this);
    UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
    Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
    pdVar2 = result->data;
    FlatVector::VerifyFlatVector(result);
    uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
    if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      uVar9 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar8 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar7 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
        uVar8 = size - uVar9;
        if (uVar10 < size - uVar9) {
          uVar8 = uVar10;
        }
        pdVar12 = pdVar2 + uVar9 * 0x10;
        uVar10 = uVar8;
        while (bVar13 = uVar10 != 0, uVar10 = uVar10 - 1, bVar13) {
          uVar3 = *(undefined8 *)(local_f8.data + uVar7 * 0x10 + 8);
          *(undefined8 *)pdVar12 = *(undefined8 *)(local_f8.data + uVar7 * 0x10);
          *(undefined8 *)(pdVar12 + 8) = uVar3;
          pdVar12 = pdVar12 + 0x10;
        }
        uVar9 = uVar9 + uVar8;
        uVar6 = uVar6 + 1;
      } while (uVar9 < size);
    }
    else {
      local_128 = 0;
      do {
        if (compressed_size <= uVar6) break;
        uVar9 = uVar6;
        if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
          uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
        }
        uVar8 = uVar6;
        if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
        }
        uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_128);
        uVar9 = size - local_128;
        if (uVar7 < size - local_128) {
          uVar9 = uVar7;
        }
        uVar7 = uVar9;
        uVar10 = local_128;
        if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
             >> (uVar8 & 0x3f) & 1) == 0) {
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
          }
        }
        else {
          pdVar12 = pdVar2 + local_128 * 0x10;
          while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
            uVar3 = *(undefined8 *)(local_f8.data + uVar8 * 0x10 + 8);
            *(undefined8 *)pdVar12 = *(undefined8 *)(local_f8.data + uVar8 * 0x10);
            *(undefined8 *)(pdVar12 + 8) = uVar3;
            TemplatedValidityMask<unsigned_long>::SetValid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
            uVar10 = uVar10 + 1;
            pdVar12 = pdVar12 + 0x10;
          }
        }
        local_128 = local_128 + uVar9;
        uVar6 = uVar6 + 1;
      } while (local_128 < size);
    }
    break;
  default:
    if (PVar1 == VARCHAR) {
      ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,
                 (__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)
                 &pVVar4->auxiliary);
      shared_ptr<duckdb::VectorBuffer,_true>::operator=
                (&result->auxiliary,(shared_ptr<duckdb::VectorBuffer,_true> *)&local_60);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (this);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
      Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
      Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
      pdVar2 = result->data;
      FlatVector::VerifyFlatVector(result);
      uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
      if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar9 = 0;
        do {
          if (compressed_size <= uVar6) break;
          uVar8 = uVar6;
          if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
          }
          uVar7 = uVar6;
          if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
          }
          uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
          uVar8 = size - uVar9;
          if (uVar10 < size - uVar9) {
            uVar8 = uVar10;
          }
          pdVar12 = pdVar2 + uVar9 * 0x10;
          uVar10 = uVar8;
          while (bVar13 = uVar10 != 0, uVar10 = uVar10 - 1, bVar13) {
            uVar3 = *(undefined8 *)(local_f8.data + uVar7 * 0x10 + 8);
            *(undefined8 *)pdVar12 = *(undefined8 *)(local_f8.data + uVar7 * 0x10);
            *(undefined8 *)(pdVar12 + 8) = uVar3;
            pdVar12 = pdVar12 + 0x10;
          }
          uVar9 = uVar9 + uVar8;
          uVar6 = uVar6 + 1;
        } while (uVar9 < size);
      }
      else {
        local_128 = 0;
        do {
          if (compressed_size <= uVar6) break;
          uVar9 = uVar6;
          if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
          }
          uVar8 = uVar6;
          if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
          }
          uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_128);
          uVar9 = size - local_128;
          if (uVar7 < size - local_128) {
            uVar9 = uVar7;
          }
          uVar7 = uVar9;
          uVar10 = local_128;
          if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
            while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
              uVar10 = uVar10 + 1;
            }
          }
          else {
            pdVar12 = pdVar2 + local_128 * 0x10;
            while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
              uVar3 = *(undefined8 *)(local_f8.data + uVar8 * 0x10 + 8);
              *(undefined8 *)pdVar12 = *(undefined8 *)(local_f8.data + uVar8 * 0x10);
              *(undefined8 *)(pdVar12 + 8) = uVar3;
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
              uVar10 = uVar10 + 1;
              pdVar12 = pdVar12 + 0x10;
            }
          }
          local_128 = local_128 + uVar9;
          uVar6 = uVar6 + 1;
        } while (local_128 < size);
      }
    }
    else {
      if (PVar1 != INT128) goto switchD_018b57cd_caseD_a;
      pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (&run_end_encoding->run_ends);
      pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (this);
      UnifiedVectorFormat::UnifiedVectorFormat(&run_end_format);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
      Vector::ToUnifiedFormat(pVVar4,compressed_size,&run_end_format);
      Vector::ToUnifiedFormat(pVVar5,compressed_size,&local_f8);
      pdVar2 = result->data;
      FlatVector::VerifyFlatVector(result);
      uVar6 = FindRunIndex<int>((int *)run_end_format.data,compressed_size,scan_offset);
      if (local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar9 = 0;
        do {
          if (compressed_size <= uVar6) break;
          uVar8 = uVar6;
          if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
          }
          uVar7 = uVar6;
          if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
            uVar7 = (ulong)(local_f8.sel)->sel_vector[uVar6];
          }
          uVar10 = (long)*(int *)(run_end_format.data + uVar8 * 4) - (scan_offset + uVar9);
          uVar8 = size - uVar9;
          if (uVar10 < size - uVar9) {
            uVar8 = uVar10;
          }
          pdVar12 = pdVar2 + uVar9 * 0x10;
          uVar10 = uVar8;
          while (bVar13 = uVar10 != 0, uVar10 = uVar10 - 1, bVar13) {
            uVar3 = *(undefined8 *)(local_f8.data + uVar7 * 0x10 + 8);
            *(undefined8 *)pdVar12 = *(undefined8 *)(local_f8.data + uVar7 * 0x10);
            *(undefined8 *)(pdVar12 + 8) = uVar3;
            pdVar12 = pdVar12 + 0x10;
          }
          uVar9 = uVar9 + uVar8;
          uVar6 = uVar6 + 1;
        } while (uVar9 < size);
      }
      else {
        local_128 = 0;
        do {
          if (compressed_size <= uVar6) break;
          uVar9 = uVar6;
          if ((run_end_format.sel)->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)(run_end_format.sel)->sel_vector[uVar6];
          }
          uVar8 = uVar6;
          if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)(local_f8.sel)->sel_vector[uVar6];
          }
          uVar7 = (long)*(int *)(run_end_format.data + uVar9 * 4) - (scan_offset + local_128);
          uVar9 = size - local_128;
          if (uVar7 < size - local_128) {
            uVar9 = uVar7;
          }
          uVar7 = uVar9;
          uVar10 = local_128;
          if ((local_f8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
            while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
              uVar10 = uVar10 + 1;
            }
          }
          else {
            pdVar12 = pdVar2 + local_128 * 0x10;
            while (bVar13 = uVar7 != 0, uVar7 = uVar7 - 1, bVar13) {
              uVar3 = *(undefined8 *)(local_f8.data + uVar8 * 0x10 + 8);
              *(undefined8 *)pdVar12 = *(undefined8 *)(local_f8.data + uVar8 * 0x10);
              *(undefined8 *)(pdVar12 + 8) = uVar3;
              TemplatedValidityMask<unsigned_long>::SetValid
                        (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar10);
              uVar10 = uVar10 + 1;
              pdVar12 = pdVar12 + 0x10;
            }
          }
          local_128 = local_128 + uVar9;
          uVar6 = uVar6 + 1;
        } while (local_128 < size);
      }
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_f8);
  UnifiedVectorFormat::~UnifiedVectorFormat(&run_end_format);
  return;
}

Assistant:

static void FlattenRunEndsSwitch(Vector &result, ArrowRunEndEncodingState &run_end_encoding, idx_t compressed_size,
                                 idx_t scan_offset, idx_t size) {
	auto &values = *run_end_encoding.values;
	auto physical_type = values.GetType().InternalType();

	switch (physical_type) {
	case PhysicalType::INT8:
		FlattenRunEnds<RUN_END_TYPE, int8_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT16:
		FlattenRunEnds<RUN_END_TYPE, int16_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT32:
		FlattenRunEnds<RUN_END_TYPE, int32_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT64:
		FlattenRunEnds<RUN_END_TYPE, int64_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INT128:
		FlattenRunEnds<RUN_END_TYPE, hugeint_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::UINT8:
		FlattenRunEnds<RUN_END_TYPE, uint8_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::UINT16:
		FlattenRunEnds<RUN_END_TYPE, uint16_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::UINT32:
		FlattenRunEnds<RUN_END_TYPE, uint32_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::UINT64:
		FlattenRunEnds<RUN_END_TYPE, uint64_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::BOOL:
		FlattenRunEnds<RUN_END_TYPE, bool>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::FLOAT:
		FlattenRunEnds<RUN_END_TYPE, float>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::DOUBLE:
		FlattenRunEnds<RUN_END_TYPE, double>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::INTERVAL:
		FlattenRunEnds<RUN_END_TYPE, interval_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	case PhysicalType::VARCHAR: {
		// Share the string heap, we don't need to allocate new strings, we just reference the existing ones
		result.SetAuxiliary(values.GetAuxiliary());
		FlattenRunEnds<RUN_END_TYPE, string_t>(result, run_end_encoding, compressed_size, scan_offset, size);
		break;
	}
	default:
		throw NotImplementedException("RunEndEncoded value type '%s' not supported yet", TypeIdToString(physical_type));
	}
}